

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol_exception.cc
# Opt level: O1

void __thiscall rcdiscover::WOLException::WOLException(WOLException *this,string *msg,int errnum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer pcVar3;
  undefined8 uVar4;
  uint uVar5;
  undefined8 *puVar6;
  uint uVar7;
  ulong uVar8;
  uint __val;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)msg);
  *(undefined ***)this = &PTR__WOLException_00111c38;
  this->errnum_ = errnum;
  pcVar3 = (msg->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + msg->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  __val = -errnum;
  if (0 < errnum) {
    __val = errnum;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar7 = (uint)uVar8;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_0010b4ea;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_0010b4ea;
      }
      if (uVar7 < 10000) goto LAB_0010b4ea;
      uVar8 = uVar8 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_0010b4ea:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(errnum >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)errnum >> 0x1f) + (long)local_50),__len,__val);
  uVar8 = 0xf;
  if (local_70 != local_60) {
    uVar8 = local_60[0];
  }
  if (uVar8 < (ulong)(local_48 + local_68)) {
    uVar8 = 0xf;
    if (local_50 != local_40) {
      uVar8 = local_40[0];
    }
    if ((ulong)(local_48 + local_68) <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_70);
      goto LAB_0010b578;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50);
LAB_0010b578:
  paVar1 = &(this->msg_).field_2;
  (this->msg_)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar2) {
    uVar4 = puVar6[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->msg_).field_2 + 8) = uVar4;
  }
  else {
    (this->msg_)._M_dataplus._M_p = (pointer)*puVar6;
    (this->msg_).field_2._M_allocated_capacity = *psVar2;
  }
  (this->msg_)._M_string_length = puVar6[1];
  *puVar6 = psVar2;
  puVar6[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return;
}

Assistant:

WOLException::WOLException(const std::string& msg, const int errnum) :
  std::runtime_error(msg),
  errnum_(errnum),
  msg_(msg + " - " + std::to_string(errnum))
{ }